

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O1

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  uint uVar6;
  undefined1 (*pauVar7) [32];
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [32];
  uint uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar17 [64];
  undefined1 auVar16 [32];
  
  iVar2 = a->c;
  if (0 < (long)iVar2) {
    uVar6 = a->h * a->w * a->d * a->elempack;
    lVar10 = 0;
    do {
      pauVar11 = (undefined1 (*) [32])(a->cstep * lVar10 * a->elemsize + (long)a->data);
      pauVar12 = (undefined1 (*) [32])(b->cstep * lVar10 * b->elemsize + (long)b->data);
      pauVar7 = (undefined1 (*) [32])(c->cstep * lVar10 * c->elemsize + (long)c->data);
      if ((int)uVar6 < 8) {
        uVar13 = 0;
      }
      else {
        iVar8 = 7;
        do {
          auVar1 = *pauVar11;
          auVar4 = vrcpps_avx(*pauVar12);
          auVar17._0_4_ = auVar1._0_4_ * auVar4._0_4_;
          auVar17._4_4_ = auVar1._4_4_ * auVar4._4_4_;
          auVar17._8_4_ = auVar1._8_4_ * auVar4._8_4_;
          auVar17._12_4_ = auVar1._12_4_ * auVar4._12_4_;
          auVar17._16_4_ = auVar1._16_4_ * auVar4._16_4_;
          auVar17._20_4_ = auVar1._20_4_ * auVar4._20_4_;
          auVar17._28_36_ = in_ZMM3._28_36_;
          auVar17._24_4_ = auVar1._24_4_ * auVar4._24_4_;
          auVar16 = auVar17._0_32_;
          in_ZMM3 = ZEXT3264(auVar16);
          auVar5 = vfmsub213ps_fma(*pauVar12,auVar16,auVar1);
          auVar5 = vfnmadd213ps_fma(ZEXT1632(auVar5),auVar4,auVar16);
          *pauVar7 = ZEXT1632(auVar5);
          pauVar11 = pauVar11 + 1;
          pauVar12 = pauVar12 + 1;
          pauVar7 = pauVar7 + 1;
          iVar8 = iVar8 + 8;
          uVar13 = uVar6 & 0xfffffff8;
        } while (iVar8 < (int)uVar6);
      }
      uVar9 = uVar13 | 3;
      while ((int)uVar9 < (int)uVar6) {
        auVar5 = *(undefined1 (*) [16])*pauVar11;
        auVar3 = vrcpps_avx(*(undefined1 (*) [16])*pauVar12);
        auVar15._0_4_ = auVar5._0_4_ * auVar3._0_4_;
        auVar15._4_4_ = auVar5._4_4_ * auVar3._4_4_;
        auVar15._8_4_ = auVar5._8_4_ * auVar3._8_4_;
        auVar15._12_4_ = auVar5._12_4_ * auVar3._12_4_;
        in_ZMM3 = ZEXT1664(auVar15);
        auVar5 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar12,auVar15,auVar5);
        auVar5 = vfnmadd213ps_fma(auVar5,auVar3,auVar15);
        *(undefined1 (*) [16])*pauVar7 = auVar5;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        pauVar7 = (undefined1 (*) [32])((long)*pauVar7 + 0x10);
        uVar9 = uVar13 + 7;
        uVar13 = uVar13 + 4;
      }
      if (uVar6 - uVar13 != 0 && (int)uVar13 <= (int)uVar6) {
        lVar14 = 0;
        do {
          *(float *)((long)*pauVar7 + lVar14 * 4) =
               *(float *)(*pauVar11 + lVar14 * 4) / *(float *)(*pauVar12 + lVar14 * 4);
          lVar14 = lVar14 + 1;
        } while (uVar6 - uVar13 != (int)lVar14);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return iVar2;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}